

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

If_DsdObj_t * If_DsdObjAlloc(If_DsdMan_t *p,int Type,int nFans)

{
  int iVar1;
  If_DsdObj_t *pIVar2;
  void **ppvVar3;
  uint uVar4;
  
  pIVar2 = (If_DsdObj_t *)
           Mem_FlexEntryFetch(p->pMem,((nFans & 1U) + ((uint)(nFans - (nFans >> 0x1f)) >> 1)) * 8 +
                                      8);
  *pIVar2 = (If_DsdObj_t)0x0;
  uVar4 = nFans << 0x1b | Type & 7U;
  *(uint *)&pIVar2->field_0x4 = uVar4;
  pIVar2->Id = (p->vObjs).nSize;
  *(uint *)&pIVar2->field_0x4 = (p->fNewAsUseless & 1U) << 8 | uVar4;
  uVar4 = (p->vObjs).nSize;
  if (uVar4 == (p->vObjs).nCap) {
    if ((int)uVar4 < 0x10) {
      ppvVar3 = (p->vObjs).pArray;
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      (p->vObjs).pArray = ppvVar3;
      (p->vObjs).nCap = 0x10;
    }
    else {
      ppvVar3 = (p->vObjs).pArray;
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar4 << 4);
      }
      (p->vObjs).pArray = ppvVar3;
      (p->vObjs).nCap = uVar4 * 2;
    }
  }
  else {
    ppvVar3 = (p->vObjs).pArray;
  }
  iVar1 = (p->vObjs).nSize;
  (p->vObjs).nSize = iVar1 + 1;
  ppvVar3[iVar1] = pIVar2;
  Vec_IntPush(&p->vNexts,0);
  Vec_IntPush(&p->vTruths,-1);
  iVar1 = (p->vNexts).nSize;
  if (iVar1 == (p->vObjs).nSize) {
    if ((p->vTruths).nSize == iVar1) {
      return pIVar2;
    }
    __assert_fail("Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x105,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
  }
  __assert_fail("Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x104,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
}

Assistant:

If_DsdObj_t * If_DsdObjAlloc( If_DsdMan_t * p, int Type, int nFans )
{
    int nWords = If_DsdObjWordNum( nFans );
    If_DsdObj_t * pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * nWords );
    If_DsdObjClean( pObj );
    pObj->Type   = Type;
    pObj->nFans  = nFans;
    pObj->Id     = Vec_PtrSize( &p->vObjs );
    pObj->fMark  = p->fNewAsUseless;
    pObj->Count  = 0;
    Vec_PtrPush( &p->vObjs, pObj );
    Vec_IntPush( &p->vNexts, 0 );
    Vec_IntPush( &p->vTruths, -1 );
    assert( Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs) );
    assert( Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs) );
    return pObj;
}